

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::CopyToFunctionGlobalState::CopyToFunctionGlobalState
          (CopyToFunctionGlobalState *this,ClientContext *context)

{
  _Head_base<0UL,_duckdb::StorageLock_*,_false> this_00;
  ClientConfig *pCVar1;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__CopyToFunctionGlobalState_019c6740;
  StorageLock::StorageLock(&this->lock);
  (this->initialized)._M_base._M_i = false;
  (this->rows_copied).super___atomic_base<unsigned_long>._M_i = 0;
  (this->last_file_offset).super___atomic_base<unsigned_long>._M_i = 0;
  (this->global_state).
  super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (GlobalFunctionData *)0x0;
  (this->created_directories)._M_h._M_buckets = &(this->created_directories)._M_h._M_single_bucket;
  (this->created_directories)._M_h._M_bucket_count = 1;
  (this->created_directories)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->created_directories)._M_h._M_element_count = 0;
  (this->created_directories)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->created_directories)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->created_directories)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->partition_state).internal.
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->partition_state).internal.
  super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->written_files).
  super_vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->written_files).
  super_vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->written_files).
  super_vector<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00._M_head_impl = (StorageLock *)operator_new(0x10);
  StorageLock::StorageLock(this_00._M_head_impl);
  (this->file_write_lock_if_rotating).
  super_unique_ptr<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>._M_t.
  super___uniq_ptr_impl<duckdb::StorageLock,_std::default_delete<duckdb::StorageLock>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::StorageLock_*,_std::default_delete<duckdb::StorageLock>_>.
  super__Head_base<0UL,_duckdb::StorageLock_*,_false>._M_head_impl = this_00._M_head_impl;
  (this->active_partitioned_writes)._M_h._M_buckets =
       &(this->active_partitioned_writes)._M_h._M_single_bucket;
  (this->active_partitioned_writes)._M_h._M_bucket_count = 1;
  (this->active_partitioned_writes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->active_partitioned_writes)._M_h._M_element_count = 0;
  (this->active_partitioned_writes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->active_partitioned_writes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->active_partitioned_writes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->previous_partitions)._M_h._M_buckets = &(this->previous_partitions)._M_h._M_single_bucket;
  (this->previous_partitions)._M_h._M_bucket_count = 1;
  (this->previous_partitions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->previous_partitions)._M_h._M_element_count = 0;
  (this->previous_partitions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->previous_partitions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->previous_partitions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pCVar1 = ClientConfig::GetConfig(context);
  this->max_open_files = pCVar1->partitioned_write_max_open_files;
  return;
}

Assistant:

explicit CopyToFunctionGlobalState(ClientContext &context)
	    : initialized(false), rows_copied(0), last_file_offset(0),
	      file_write_lock_if_rotating(make_uniq<StorageLock>()) {
		max_open_files = ClientConfig::GetConfig(context).partitioned_write_max_open_files;
	}